

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O0

void Int_ManPrepareInter(Int_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  bool bVar4;
  int local_12c;
  int v;
  int VarAB;
  int Var;
  Sto_Cls_t *pClause;
  uint uTruths [8] [8];
  Int_Man_t *p_local;
  
  memcpy(&pClause,&DAT_00cf6dd0,0x100);
  if (8 < p->nVarsAB) {
    __assert_fail("p->nVarsAB <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                  ,0x3c3,"void Int_ManPrepareInter(Int_Man_t *)");
  }
  _VarAB = p->pCnf->pHead;
  while( true ) {
    bVar4 = false;
    if (_VarAB != (Sto_Cls_t *)0x0) {
      bVar4 = (*(uint *)&_VarAB->field_0x1c >> 1 & 1) != 0;
    }
    if (!bVar4) break;
    if ((*(uint *)&_VarAB->field_0x1c & 1) == 0) {
      puVar3 = Int_ManTruthRead(p,_VarAB);
      Int_ManTruthFill(puVar3,p->nWords);
    }
    else {
      puVar3 = Int_ManTruthRead(p,_VarAB);
      Int_ManTruthClear(puVar3,p->nWords);
      for (local_12c = 0; local_12c < (int)(*(uint *)&_VarAB->field_0x1c >> 3 & 0xffffff);
          local_12c = local_12c + 1) {
        iVar1 = lit_var(*(lit *)((long)&_VarAB[1].pNext + (long)local_12c * 4));
        if (p->pVarTypes[iVar1] < 0) {
          iVar1 = -1 - p->pVarTypes[iVar1];
          if ((iVar1 < 0) || (p->nVarsAB <= iVar1)) {
            __assert_fail("VarAB >= 0 && VarAB < p->nVarsAB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                          ,0x3d6,"void Int_ManPrepareInter(Int_Man_t *)");
          }
          iVar2 = lit_sign(*(lit *)((long)&_VarAB[1].pNext + (long)local_12c * 4));
          if (iVar2 == 0) {
            puVar3 = Int_ManTruthRead(p,_VarAB);
            Int_ManTruthOr(puVar3,uTruths[(long)iVar1 + -1] + 6,p->nWords);
          }
          else {
            puVar3 = Int_ManTruthRead(p,_VarAB);
            Int_ManTruthOrNot(puVar3,uTruths[(long)iVar1 + -1] + 6,p->nWords);
          }
        }
      }
    }
    _VarAB = _VarAB->pNext;
  }
  return;
}

Assistant:

void Int_ManPrepareInter( Int_Man_t * p )
{
    // elementary truth tables
    unsigned uTruths[8][8] = {
        { 0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA },
        { 0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC },
        { 0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0 },
        { 0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00 },
        { 0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000 }, 
        { 0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF } 
    };
    Sto_Cls_t * pClause;
    int Var, VarAB, v;
    assert( p->nVarsAB <= 8 );

    // set interpolants for root clauses
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        if ( !pClause->fA ) // clause of B
        {
            Int_ManTruthFill( Int_ManTruthRead(p, pClause), p->nWords );
//            Int_ManPrintInterOne( p, pClause );
            continue;
        }
        // clause of A
        Int_ManTruthClear( Int_ManTruthRead(p, pClause), p->nWords );
        for ( v = 0; v < (int)pClause->nLits; v++ )
        {
            Var = lit_var(pClause->pLits[v]);
            if ( p->pVarTypes[Var] < 0 ) // global var
            {
                VarAB = -p->pVarTypes[Var]-1;
                assert( VarAB >= 0 && VarAB < p->nVarsAB );
                if ( lit_sign(pClause->pLits[v]) ) // negative var
                    Int_ManTruthOrNot( Int_ManTruthRead(p, pClause), uTruths[VarAB], p->nWords );
                else
                    Int_ManTruthOr( Int_ManTruthRead(p, pClause), uTruths[VarAB], p->nWords );
            }
        }
//        Int_ManPrintInterOne( p, pClause );
    }
}